

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::ProcessCacheArg(cmake *this,string *var,string *value,CacheEntryType type)

{
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  string *psVar4;
  string cachedValue;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  if (this->WarnUnusedCli == true) {
    cVar3 = cmState::GetInitializedCacheValue
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,var);
    if (cVar3.Value == (string *)0x0) goto LAB_003e9f1e;
    bVar1 = true;
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  else {
LAB_003e9f1e:
    bVar1 = false;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"No help, variable specified on the command line.","");
  AddCacheEntry(this,var,(cmValue)value,(string *)local_50,type);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (this->WarnUnusedCli != true) goto LAB_003e9fc6;
  if (bVar1) {
    psVar4 = (string *)
             cmState::GetInitializedCacheValue
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl,var);
    if (psVar4 == (string *)0x0) {
      psVar4 = &cmValue::Empty_abi_cxx11_;
    }
    if (local_68 == psVar4->_M_string_length) {
      if (local_68 == 0) goto LAB_003e9fc6;
      iVar2 = bcmp(local_70,(psVar4->_M_dataplus)._M_p,local_68);
      if (iVar2 == 0) goto LAB_003e9fc6;
    }
  }
  WatchUnusedCli(this,var);
LAB_003e9fc6:
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void cmake::ProcessCacheArg(const std::string& var, const std::string& value,
                            cmStateEnums::CacheEntryType type)
{
  // The value is transformed if it is a filepath for example, so
  // we can't compare whether the value is already in the cache until
  // after we call AddCacheEntry.
  bool haveValue = false;
  std::string cachedValue;
  if (this->WarnUnusedCli) {
    if (cmValue v = this->State->GetInitializedCacheValue(var)) {
      haveValue = true;
      cachedValue = *v;
    }
  }

  this->AddCacheEntry(
    var, value, "No help, variable specified on the command line.", type);

  if (this->WarnUnusedCli) {
    if (!haveValue ||
        cachedValue != *this->State->GetInitializedCacheValue(var)) {
      this->WatchUnusedCli(var);
    }
  }
}